

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O0

void connection_cb(uv_stream_t *server,int status)

{
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_buf_t buf;
  int r;
  int status_local;
  uv_stream_t *server_local;
  
  buf.len._4_4_ = status;
  if (server != (uv_stream_t *)&tcp_server) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x30,"server","==","(uv_stream_t*)&tcp_server",server,"==",&tcp_server);
    abort();
  }
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x31,"status","==","0",(long)status,"==",0);
    abort();
  }
  buf.len._0_4_ = uv_tcp_init(tcp_server.loop,&tcp_peer);
  if ((long)(int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x34,"r","==","0",(long)(int)buf.len,"==",0);
    abort();
  }
  buf.len._0_4_ = uv_accept(&tcp_server,&tcp_peer);
  if ((long)(int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x37,"r","==","0",(long)(int)buf.len,"==",0);
    abort();
  }
  buf.len._0_4_ = uv_read_start(&tcp_peer,alloc_cb,read_cb);
  if ((long)(int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x3a,"r","==","0",(long)(int)buf.len,"==",0);
    abort();
  }
  eval_a = anon_var_dwarf_3c5d8;
  buf.base = (char *)0x6;
  buf.len._0_4_ = uv_write(&write_req,&tcp_peer,&eval_a,1,write_cb);
  if ((long)(int)buf.len != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-write-to-half-open-connection.c"
            ,0x40,"r","==","0",(long)(int)buf.len,"==",0);
    abort();
  }
  return;
}

Assistant:

static void connection_cb(uv_stream_t* tcp, int status) {
  ASSERT_OK(status);

  ASSERT_OK(uv_tcp_init(tcp->loop, &incoming));
  ASSERT_OK(uv_accept(tcp, (uv_stream_t*) &incoming));
  ASSERT_OK(uv_read_start((uv_stream_t*) &incoming,
                          conn_alloc_cb,
                          conn_read_cb));

  connection_cb_called++;
}